

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.cpp
# Opt level: O0

RenderPassVkImpl * __thiscall
Diligent::RenderPassCache::GetRenderPass(RenderPassCache *this,RenderPassCacheKey *Key)

{
  RefCntAutoPtr<Diligent::RenderPassVkImpl> *this_00;
  SHADING_RATE_FORMAT SVar1;
  RenderDeviceVkImpl *this_01;
  bool bVar2;
  GraphicsAdapterInfo *pGVar3;
  Char *pCVar4;
  ostream *poVar5;
  TextureFormatAttribs *pTVar6;
  IRenderPass **ppRenderPass;
  RenderPassVkImpl *pRVar7;
  pointer ppVar8;
  char *pcVar9;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_false,_true>,_bool>
  pVar10;
  undefined1 local_3f0 [8];
  string msg_1;
  RefCntAutoPtr<Diligent::RenderPassVkImpl> pRenderPass;
  string PassName;
  stringstream local_3a0 [4];
  Uint32 rt;
  stringstream PassNameSS;
  ostream local_390 [376];
  anon_union_8_3_e2189aaa_for_Vector2<unsigned_int>_1 local_218;
  undefined1 local_210 [8];
  RenderPassDesc RPDesc;
  ShadingRateAttachment ShadingRate;
  SubpassDesc Subpass;
  undefined1 local_178 [8];
  string msg;
  ShadingRateProperties *SRProps;
  uint2 SRTileSize;
  TEXTURE_FORMAT SRFormat;
  array<Diligent::AttachmentReference,_10UL> AttachmentReferences;
  array<Diligent::RenderPassAttachmentDesc,_10UL> Attachments;
  _Node_iterator_base<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_true>
  local_38;
  iterator it;
  lock_guard<std::mutex> Lock;
  RenderPassCacheKey *Key_local;
  RenderPassCache *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&it,&this->m_Mutex);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>,_Diligent::RenderPassCache::RenderPassCacheKeyHash,_std::equal_to<Diligent::RenderPassCache::RenderPassCacheKey>,_std::allocator<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>_>_>
       ::find(&this->m_Cache,Key);
  Attachments._M_elems[9]._8_8_ =
       std::
       unordered_map<Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>,_Diligent::RenderPassCache::RenderPassCacheKeyHash,_std::equal_to<Diligent::RenderPassCache::RenderPassCacheKey>,_std::allocator<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>_>_>
       ::end(&this->m_Cache);
  bVar2 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_true>
                      *)&Attachments._M_elems[9].InitialState);
  if (bVar2) {
    std::array<Diligent::RenderPassAttachmentDesc,_10UL>::array
              ((array<Diligent::RenderPassAttachmentDesc,_10UL> *)
               (AttachmentReferences._M_elems + 9));
    std::array<Diligent::AttachmentReference,_10UL>::array
              ((array<Diligent::AttachmentReference,_10UL> *)((long)&SRTileSize.field_0 + 4));
    SRTileSize.field_0.field_0.x._2_2_ = 0;
    Vector2<unsigned_int>::Vector2((Vector2<unsigned_int> *)((long)&SRProps + 4));
    if ((Key->EnableVRS & 1U) != 0) {
      pGVar3 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                         ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this->m_DeviceVkImpl);
      msg.field_2._8_8_ = &pGVar3->ShadingRate;
      SVar1 = (pGVar3->ShadingRate).Format;
      if (SVar1 == SHADING_RATE_FORMAT_PALETTE) {
        SRTileSize.field_0.field_0.x._2_2_ = 0x3e;
      }
      else if (SVar1 == SHADING_RATE_FORMAT_UNORM8) {
        SRTileSize.field_0.field_0.x._2_2_ = 0x31;
      }
      else {
        FormatString<char[31]>((string *)local_178,(char (*) [31])"Unexpected shading rate format");
        pCVar4 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar4,"GetRenderPass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassCache.cpp"
                   ,0xd4);
        std::__cxx11::string::~string((string *)local_178);
      }
      Vector2<unsigned_int>::Vector2
                ((Vector2<unsigned_int> *)&Subpass.pShadingRateAttachment,
                 *(uint *)(msg.field_2._8_8_ + 0x28),*(uint *)(msg.field_2._8_8_ + 0x2c));
      stack0xfffffffffffffeb4 =
           (anon_union_8_3_e2189aaa_for_Vector2<unsigned_int>_1)Subpass.pShadingRateAttachment;
    }
    SubpassDesc::SubpassDesc((SubpassDesc *)ShadingRate.TileSize);
    ShadingRateAttachment::ShadingRateAttachment((ShadingRateAttachment *)&RPDesc.pDependencies);
    local_218.field_0 = stack0xfffffffffffffeb4;
    GetImplicitRenderPassDesc
              ((RenderPassDesc *)local_210,(uint)Key->NumRenderTargets,Key->RTVFormats,
               Key->DSVFormat,(bool)(Key->ReadOnlyDSV & 1),Key->SampleCount,
               SRTileSize.field_0.field_0.x._2_2_,(uint2)stack0xfffffffffffffeb4,
               (array<Diligent::RenderPassAttachmentDesc,_10UL> *)
               (AttachmentReferences._M_elems + 9),
               (array<Diligent::AttachmentReference,_10UL> *)((long)&SRTileSize.field_0 + 4),
               (SubpassDesc *)ShadingRate.TileSize,(ShadingRateAttachment *)&RPDesc.pDependencies);
    std::__cxx11::stringstream::stringstream(local_3a0);
    poVar5 = std::operator<<(local_390,"Implicit render pass: RT count: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)Key->NumRenderTargets);
    poVar5 = std::operator<<(poVar5,"; sample count: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)Key->SampleCount);
    poVar5 = std::operator<<(poVar5,"; DSV Format: ");
    pTVar6 = GetTextureFormatAttribs(Key->DSVFormat);
    std::operator<<(poVar5,pTVar6->Name);
    if (Key->NumRenderTargets != '\0') {
      pcVar9 = "; RTV Format: ";
      if (1 < Key->NumRenderTargets) {
        pcVar9 = "; RTV Formats: ";
      }
      std::operator<<(local_390,pcVar9);
      for (PassName.field_2._12_4_ = 0; (uint)PassName.field_2._12_4_ < (uint)Key->NumRenderTargets;
          PassName.field_2._12_4_ = PassName.field_2._12_4_ + 1) {
        pcVar9 = "";
        if (PassName.field_2._12_4_ != 0) {
          pcVar9 = ", ";
        }
        poVar5 = std::operator<<(local_390,pcVar9);
        pTVar6 = GetTextureFormatAttribs(Key->RTVFormats[(uint)PassName.field_2._12_4_]);
        std::operator<<(poVar5,pTVar6->Name);
      }
    }
    if ((Key->EnableVRS & 1U) != 0) {
      std::operator<<(local_390,"; VRS");
    }
    std::__cxx11::stringstream::str();
    local_210 = (undefined1  [8])std::__cxx11::string::c_str();
    this_00 = (RefCntAutoPtr<Diligent::RenderPassVkImpl> *)((long)&msg_1.field_2 + 8);
    RefCntAutoPtr<Diligent::RenderPassVkImpl>::RefCntAutoPtr(this_00);
    this_01 = this->m_DeviceVkImpl;
    ppRenderPass = RefCntAutoPtr<Diligent::RenderPassVkImpl>::RawDblPtr<Diligent::IRenderPass,void>
                             (this_00);
    RenderDeviceVkImpl::CreateRenderPass(this_01,(RenderPassDesc *)local_210,ppRenderPass,true);
    pRVar7 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                       ((RefCntAutoPtr *)(msg_1.field_2._M_local_buf + 8));
    if (pRVar7 != (RenderPassVkImpl *)0x0) {
      pVar10 = std::
               unordered_map<Diligent::RenderPassCache::RenderPassCacheKey,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>,Diligent::RenderPassCache::RenderPassCacheKeyHash,std::equal_to<Diligent::RenderPassCache::RenderPassCacheKey>,std::allocator<std::pair<Diligent::RenderPassCache::RenderPassCacheKey_const,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>>>
               ::
               emplace<Diligent::RenderPassCache::RenderPassCacheKey_const&,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>
                         ((unordered_map<Diligent::RenderPassCache::RenderPassCacheKey,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>,Diligent::RenderPassCache::RenderPassCacheKeyHash,std::equal_to<Diligent::RenderPassCache::RenderPassCacheKey>,std::allocator<std::pair<Diligent::RenderPassCache::RenderPassCacheKey_const,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>>>
                           *)&this->m_Cache,Key,
                          (RefCntAutoPtr<Diligent::RenderPassVkImpl> *)((long)&msg_1.field_2 + 8));
      local_38._M_cur =
           (__node_type *)
           pVar10.first.
           super__Node_iterator_base<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_true>
           ._M_cur;
    }
    else {
      FormatString<char[29]>((string *)local_3f0,(char (*) [29])"Failed to create render pass");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"GetRenderPass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassCache.cpp"
                 ,0xf4);
      std::__cxx11::string::~string((string *)local_3f0);
      this_local = (RenderPassCache *)0x0;
    }
    RefCntAutoPtr<Diligent::RenderPassVkImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::RenderPassVkImpl> *)((long)&msg_1.field_2 + 8));
    std::__cxx11::string::~string((string *)&pRenderPass);
    std::__cxx11::stringstream::~stringstream(local_3a0);
    if (pRVar7 == (RenderPassVkImpl *)0x0) goto LAB_0033e214;
  }
  ppVar8 = std::__detail::
           _Node_iterator<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_false,_true>
                         *)&local_38);
  this_local = (RenderPassCache *)
               Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                         ((RefCntAutoPtr *)&ppVar8->second);
LAB_0033e214:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  return (RenderPassVkImpl *)this_local;
}

Assistant:

RenderPassVkImpl* RenderPassCache::GetRenderPass(const RenderPassCacheKey& Key)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
    auto                        it = m_Cache.find(Key);
    if (it == m_Cache.end())
    {
        // Do not zero-initialize arrays
        std::array<RenderPassAttachmentDesc, MAX_RENDER_TARGETS + 2> Attachments;
        std::array<AttachmentReference, MAX_RENDER_TARGETS + 2>      AttachmentReferences;

        TEXTURE_FORMAT SRFormat = TEX_FORMAT_UNKNOWN;
        uint2          SRTileSize;
        if (Key.EnableVRS)
        {
            const ShadingRateProperties& SRProps = m_DeviceVkImpl.GetAdapterInfo().ShadingRate;
            switch (SRProps.Format)
            {
                case SHADING_RATE_FORMAT_PALETTE: SRFormat = TEX_FORMAT_R8_UINT; break;
                case SHADING_RATE_FORMAT_UNORM8: SRFormat = TEX_FORMAT_RG8_UNORM; break;
                default:
                    UNEXPECTED("Unexpected shading rate format");
            }
            SRTileSize = {SRProps.MaxTileSize[0], SRProps.MaxTileSize[1]};
        }

        SubpassDesc           Subpass;
        ShadingRateAttachment ShadingRate;

        RenderPassDesc RPDesc = GetImplicitRenderPassDesc(Key.NumRenderTargets, Key.RTVFormats, Key.DSVFormat, Key.ReadOnlyDSV, Key.SampleCount,
                                                          SRFormat, SRTileSize, Attachments, AttachmentReferences, Subpass, ShadingRate);

        std::stringstream PassNameSS;
        PassNameSS << "Implicit render pass: RT count: " << Uint32{Key.NumRenderTargets} << "; sample count: " << Uint32{Key.SampleCount}
                   << "; DSV Format: " << GetTextureFormatAttribs(Key.DSVFormat).Name;
        if (Key.NumRenderTargets > 0)
        {
            PassNameSS << (Key.NumRenderTargets > 1 ? "; RTV Formats: " : "; RTV Format: ");
            for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
            {
                PassNameSS << (rt > 0 ? ", " : "") << GetTextureFormatAttribs(Key.RTVFormats[rt]).Name;
            }
        }
        if (Key.EnableVRS)
            PassNameSS << "; VRS";

        const std::string PassName{PassNameSS.str()};
        RPDesc.Name = PassName.c_str();

        RefCntAutoPtr<RenderPassVkImpl> pRenderPass;
        m_DeviceVkImpl.CreateRenderPass(RPDesc, pRenderPass.RawDblPtr<IRenderPass>(), /* IsDeviceInternal = */ true);
        if (pRenderPass == nullptr)
        {
            UNEXPECTED("Failed to create render pass");
            return nullptr;
        }
        it = m_Cache.emplace(Key, std::move(pRenderPass)).first;
    }

    return it->second;
}